

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O2

void getaddrinfo_cuncurrent_cb(uv_getaddrinfo_t *handle,int status,addrinfo *res)

{
  int *__ptr;
  int *piVar1;
  long lVar2;
  uv_getaddrinfo_t *puVar3;
  char *pcVar4;
  undefined8 uStack_10;
  
  __ptr = (int *)handle->data;
  piVar1 = callback_counts;
  puVar3 = getaddrinfo_handles;
  lVar2 = 0;
  do {
    if (lVar2 == 10) {
      pcVar4 = "i < CONCURRENT_COUNT";
      uStack_10 = 0x4a;
LAB_0012f288:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
              ,uStack_10,pcVar4);
      abort();
    }
    if (puVar3 == handle) {
      if (*__ptr == (int)lVar2) {
        *piVar1 = *piVar1 + 1;
        free(__ptr);
        uv_freeaddrinfo(res);
        getaddrinfo_cbs = getaddrinfo_cbs + 1;
        return;
      }
      pcVar4 = "i == *data";
      uStack_10 = 0x44;
      goto LAB_0012f288;
    }
    lVar2 = lVar2 + 1;
    piVar1 = piVar1 + 1;
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

static void getaddrinfo_cuncurrent_cb(uv_getaddrinfo_t* handle,
                                      int status,
                                      struct addrinfo* res) {
  int i;
  int* data = (int*)handle->data;

  for (i = 0; i < CONCURRENT_COUNT; i++) {
    if (&getaddrinfo_handles[i] == handle) {
      ASSERT(i == *data);

      callback_counts[i]++;
      break;
    }
  }
  ASSERT (i < CONCURRENT_COUNT);

  free(data);
  uv_freeaddrinfo(res);

  getaddrinfo_cbs++;
}